

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

void __thiscall icu_63::UnicodeSet::ensureCapacity(UnicodeSet *this,int32_t newLen,UErrorCode *ec)

{
  UChar32 *pUVar1;
  
  if (this->capacity < newLen) {
    pUVar1 = (UChar32 *)uprv_realloc_63(this->list,(long)newLen * 4 + 0x40);
    if (pUVar1 == (UChar32 *)0x0) {
      *ec = U_MEMORY_ALLOCATION_ERROR;
      setToBogus(this);
      return;
    }
    this->list = pUVar1;
    this->capacity = newLen + 0x10;
  }
  return;
}

Assistant:

void UnicodeSet::ensureCapacity(int32_t newLen, UErrorCode& ec) {
    if (newLen <= capacity) {
        return;
    }
    UChar32* temp = (UChar32*) uprv_realloc(list, sizeof(UChar32) * (newLen + GROW_EXTRA));
    if (temp == NULL) {
        ec = U_MEMORY_ALLOCATION_ERROR;
        setToBogus(); // set the object to bogus state if an OOM failure occurred.
        return;
    }
    list = temp;
    capacity = newLen + GROW_EXTRA;
    // else we keep the original contents on the memory failure.
}